

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerator.cxx
# Opt level: O2

void __thiscall
cmQtAutoGenerator::Logger::ErrorFile(Logger *this,GenT genType,string *filename,string *message)

{
  string emsg;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&emsg,"  ",(allocator<char> *)&local_40);
  cmQtAutoGen::Quoted(&local_40,filename);
  std::__cxx11::string::append((string *)&emsg);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::push_back((char)&emsg);
  std::__cxx11::string::append((string *)&emsg);
  Error(this,genType,&emsg);
  std::__cxx11::string::~string((string *)&emsg);
  return;
}

Assistant:

void cmQtAutoGenerator::Logger::ErrorFile(GenT genType,
                                          std::string const& filename,
                                          std::string const& message) const
{
  std::string emsg = "  ";
  emsg += Quoted(filename);
  emsg += '\n';
  // Message
  emsg += message;
  Error(genType, emsg);
}